

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mydefs.cpp
# Opt level: O0

string * ReplaceString(string *subject,string *search,string *replace)

{
  ulong uVar1;
  string *psVar2;
  size_t pos;
  string *replace_local;
  string *search_local;
  string *subject_local;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)search,(ulong)replace);
    if (uVar1 == 0xffffffffffffffff) break;
    psVar2 = (string *)std::__cxx11::string::length();
    std::__cxx11::string::replace((ulong)search,uVar1,psVar2);
    std::__cxx11::string::length();
  }
  std::__cxx11::string::string((string *)subject,(string *)search);
  return subject;
}

Assistant:

std::string ReplaceString(std::string subject, const std::string& search, const std::string& replace) {
  size_t pos = 0;
  while ((pos = subject.find(search, pos)) != std::string::npos) {
    subject.replace(pos, search.length(), replace);
    pos += replace.length();
  }
  return subject;
}